

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O2

int Abc_NtkDetectObjClasses_rec
              (Abc_Obj_t *pObj,Vec_Int_t *vMap,Hsh_VecMan_t *pHash,Vec_Int_t *vTemp)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  Vec_Int_t *vVec1;
  Vec_Int_t *pVVar8;
  ulong uVar9;
  int *piVar10;
  long lVar11;
  int *piVar12;
  int *piVar13;
  Vec_Int_t t;
  
  iVar5 = Vec_IntEntry(vMap,pObj->Id);
  if (iVar5 == -1) {
    uVar6 = *(uint *)&pObj->field_0x14 & 0xf;
    if ((7 < uVar6) || ((0xa4U >> uVar6 & 1) == 0)) {
      __assert_fail("Abc_ObjIsCi(pObj) || Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDetect.c"
                    ,0x164,
                    "int Abc_NtkDetectObjClasses_rec(Abc_Obj_t *, Vec_Int_t *, Hsh_VecMan_t *, Vec_Int_t *)"
                   );
    }
    if ((pObj->vFanouts).nSize == 0) {
      iVar7 = pObj->Id;
      iVar5 = 0;
    }
    else {
      iVar5 = Abc_NtkDetectObjClasses_rec
                        ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanouts).pArray],vMap,pHash
                         ,vTemp);
      if ((pObj->vFanouts).nSize != 1) {
        vVec1 = Vec_IntAlloc(0x10);
        pVVar8 = Hsh_VecReadEntry(pHash,iVar5);
        vVec1->nSize = 0;
        Vec_IntAppend(vVec1,pVVar8);
        lVar11 = 0;
        do {
          if ((pObj->vFanouts).nSize <= lVar11) {
            iVar5 = Hsh_VecManAdd(pHash,vVec1);
            Vec_IntWriteEntry(vMap,pObj->Id,iVar5);
            Vec_IntFree(vVec1);
            return iVar5;
          }
          if (lVar11 != 0) {
            iVar5 = Abc_NtkDetectObjClasses_rec
                              ((Abc_Obj_t *)
                               pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar11]],vMap,pHash
                               ,vTemp);
            pVVar8 = Hsh_VecReadEntry(pHash,iVar5);
            iVar5 = vVec1->nSize;
            Vec_IntGrow(vTemp,pVVar8->nSize + iVar5);
            piVar2 = vTemp->pArray;
            piVar12 = vVec1->pArray;
            piVar10 = pVVar8->pArray;
            piVar3 = piVar12 + iVar5;
            piVar4 = piVar10 + pVVar8->nSize;
            uVar9 = 0;
            piVar13 = piVar2;
            while ((piVar12 < piVar3 && (piVar10 < piVar4))) {
              iVar7 = *piVar12;
              iVar1 = *piVar10;
              if (iVar7 == iVar1) {
                piVar12 = piVar12 + 1;
                *piVar13 = iVar7;
                piVar10 = piVar10 + 1;
              }
              else if (iVar7 < iVar1) {
                piVar12 = piVar12 + 1;
                *piVar13 = iVar7;
              }
              else {
                piVar10 = piVar10 + 1;
                *piVar13 = iVar1;
              }
              piVar13 = piVar13 + 1;
              uVar9 = uVar9 + 4;
            }
            for (; piVar12 < piVar3; piVar12 = piVar12 + 1) {
              *piVar13 = *piVar12;
              piVar13 = piVar13 + 1;
              uVar9 = uVar9 + 4;
            }
            for (; piVar10 < piVar4; piVar10 = piVar10 + 1) {
              *(int *)((long)piVar2 + uVar9) = *piVar10;
              uVar9 = uVar9 + 4;
            }
            iVar7 = (int)(uVar9 >> 2);
            vTemp->nSize = iVar7;
            if (vTemp->nCap < iVar7) {
              __assert_fail("vArr->nSize <= vArr->nCap",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x722,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                           );
            }
            if (iVar7 < iVar5) {
              __assert_fail("vArr->nSize >= vArr1->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x723,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                           );
            }
            if (iVar7 < pVVar8->nSize) {
              __assert_fail("vArr->nSize >= vArr2->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x724,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                           );
            }
            iVar7 = vVec1->nCap;
            iVar1 = vVec1->nSize;
            piVar3 = vVec1->pArray;
            iVar5 = vTemp->nSize;
            piVar4 = vTemp->pArray;
            vVec1->nCap = vTemp->nCap;
            vVec1->nSize = iVar5;
            vVec1->pArray = piVar4;
            vTemp->nCap = iVar7;
            vTemp->nSize = iVar1;
            vTemp->pArray = piVar3;
          }
          lVar11 = lVar11 + 1;
        } while( true );
      }
      iVar7 = pObj->Id;
    }
    Vec_IntWriteEntry(vMap,iVar7,iVar5);
  }
  return iVar5;
}

Assistant:

int Abc_NtkDetectObjClasses_rec( Abc_Obj_t * pObj, Vec_Int_t * vMap, Hsh_VecMan_t * pHash, Vec_Int_t * vTemp )
{
    Vec_Int_t * vArray, * vSet;
    Abc_Obj_t * pNext; int i;
    // get the CO set for this object
    int Entry = Vec_IntEntry(vMap, Abc_ObjId(pObj));
    if ( Entry != -1 ) // the set is already computed
        return Entry;
    // compute a new CO set
    assert( Abc_ObjIsCi(pObj) || Abc_ObjIsNode(pObj) );
    // if there is no fanouts, the set of COs is empty
    if ( Abc_ObjFanoutNum(pObj) == 0 )
    {
        Vec_IntWriteEntry( vMap, Abc_ObjId(pObj), 0 );
        return 0;
    }
    // compute the set for the first fanout
    Entry = Abc_NtkDetectObjClasses_rec( Abc_ObjFanout0(pObj), vMap, pHash, vTemp );
    if ( Abc_ObjFanoutNum(pObj) == 1 )
    {
        Vec_IntWriteEntry( vMap, Abc_ObjId(pObj), Entry );
        return Entry;
    }
    vSet = Vec_IntAlloc( 16 );
    // initialize the set with that of first fanout
    vArray = Hsh_VecReadEntry( pHash, Entry );
    Vec_IntClear( vSet );
    Vec_IntAppend( vSet, vArray );
    // iteratively add sets of other fanouts
    Abc_ObjForEachFanout( pObj, pNext, i )
    {
        if ( i == 0 ) 
            continue;
        Entry = Abc_NtkDetectObjClasses_rec( pNext, vMap, pHash, vTemp );
        vArray = Hsh_VecReadEntry( pHash, Entry );
        Vec_IntTwoMerge2( vSet, vArray, vTemp );
        ABC_SWAP( Vec_Int_t, *vSet, *vTemp );
    }
    // create or find new set and map the object into it
    Entry = Hsh_VecManAdd( pHash, vSet );
    Vec_IntWriteEntry( vMap, Abc_ObjId(pObj), Entry );
    Vec_IntFree( vSet );
    return Entry;
}